

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O0

void es5503_w(void *info,UINT8 offset,UINT8 data)

{
  byte bVar1;
  uint uVar2;
  ushort *puVar3;
  uint uVar4;
  int osc;
  ES5503Chip *chip;
  UINT8 data_local;
  UINT8 offset_local;
  void *info_local;
  
  if (offset < 0xe0) {
    uVar2 = offset & 0x1f;
    bVar1 = offset & 0xe0;
    if ((offset & 0xe0) == 0) {
      puVar3 = (ushort *)((long)info + (long)(int)uVar2 * 0x18 + 0x38);
      *puVar3 = *puVar3 & 0xff00;
      puVar3 = (ushort *)((long)info + (long)(int)uVar2 * 0x18 + 0x38);
      *puVar3 = *puVar3 | (ushort)data;
    }
    else if (bVar1 == 0x20) {
      puVar3 = (ushort *)((long)info + (long)(int)uVar2 * 0x18 + 0x38);
      *puVar3 = *puVar3 & 0xff;
      puVar3 = (ushort *)((long)info + (long)(int)uVar2 * 0x18 + 0x38);
      *puVar3 = *puVar3 | (ushort)data << 8;
    }
    else if (bVar1 == 0x40) {
      *(UINT8 *)((long)info + (long)(int)uVar2 * 0x18 + 0x3d) = data;
    }
    else if (bVar1 != 0x60) {
      if (bVar1 == 0x80) {
        *(uint *)((long)info + (long)(int)uVar2 * 0x18 + 0x40) = (uint)data << 8;
      }
      else if (bVar1 == 0xa0) {
        if (((*(byte *)((long)info + (long)(int)uVar2 * 0x18 + 0x3c) & 1) != 0) && ((data & 1) == 0)
           ) {
          *(undefined4 *)((long)info + (long)(int)uVar2 * 0x18 + 0x48) = 0;
        }
        *(UINT8 *)((long)info + (long)(int)uVar2 * 0x18 + 0x3c) = data;
      }
      else if (bVar1 == 0xc0) {
        if ((data & 0x40) == 0) {
          *(uint *)((long)info + (long)(int)uVar2 * 0x18 + 0x40) =
               *(uint *)((long)info + (long)(int)uVar2 * 0x18 + 0x40) & 0xffff;
        }
        else {
          *(uint *)((long)info + (long)(int)uVar2 * 0x18 + 0x40) =
               *(uint *)((long)info + (long)(int)uVar2 * 0x18 + 0x40) | 0x10000;
        }
        *(byte *)((long)info + (long)(int)uVar2 * 0x18 + 0x44) = (byte)((int)(uint)data >> 3) & 7;
        *(UINT16 *)((long)info + (long)(int)uVar2 * 0x18 + 0x3a) =
             wavesizes[*(byte *)((long)info + (long)(int)uVar2 * 0x18 + 0x44)];
        *(byte *)((long)info + (long)(int)uVar2 * 0x18 + 0x45) = data & 7;
      }
    }
  }
  else if ((offset != 0xe0) && (offset == 0xe1)) {
    *(byte *)((long)info + 0x338) = ((byte)((int)(uint)data >> 1) & 0x1f) + 1;
    uVar2 = *(uint *)((long)info + 0x33c) >> 3;
    uVar4 = *(byte *)((long)info + 0x338) + 2;
    *(uint *)((long)info + 0x344) = uVar2 / uVar4;
    if (*(long *)((long)info + 0x348) != 0) {
      (**(code **)((long)info + 0x348))
                (*(undefined8 *)((long)info + 0x350),*(undefined4 *)((long)info + 0x344),
                 (ulong)uVar2 % (ulong)uVar4);
    }
  }
  return;
}

Assistant:

static void es5503_w(void *info, UINT8 offset, UINT8 data)
{
	ES5503Chip *chip = (ES5503Chip *)info;

	if (offset < 0xe0)
	{
		int osc = offset & 0x1f;

		switch(offset & 0xe0)
		{
			case 0:     // freq lo
				chip->oscillators[osc].freq &= 0xff00;
				chip->oscillators[osc].freq |= data;
				break;

			case 0x20:      // freq hi
				chip->oscillators[osc].freq &= 0x00ff;
				chip->oscillators[osc].freq |= (data<<8);
				break;

			case 0x40:  // volume
				chip->oscillators[osc].vol = data;
				break;

			case 0x60:  // data - ignore writes
				break;

			case 0x80:  // wavetable pointer
				chip->oscillators[osc].wavetblpointer = (data<<8);
				break;

			case 0xa0:  // oscillator control
				// if a fresh key-on, reset the ccumulator
				if ((chip->oscillators[osc].control & 1) && (!(data&1)))
				{
					chip->oscillators[osc].accumulator = 0;
				}

				chip->oscillators[osc].control = data;
				break;

			case 0xc0:  // bank select / wavetable size / resolution
				if (data & 0x40)    // bank select - not used on the Apple IIgs
				{
					chip->oscillators[osc].wavetblpointer |= 0x10000;
				}
				else
				{
					chip->oscillators[osc].wavetblpointer &= 0xffff;
				}

				chip->oscillators[osc].wavetblsize = ((data>>3) & 7);
				chip->oscillators[osc].wtsize = wavesizes[chip->oscillators[osc].wavetblsize];
				chip->oscillators[osc].resolution = (data & 7);
				break;
		}
	}
	else     // global registers
	{
		switch (offset)
		{
			case 0xe0:  // interrupt status
				break;

			case 0xe1:  // oscillator enable
				chip->oscsenabled = 1 + ((data>>1) & 0x1f);

				chip->output_rate = (chip->clock/8)/(2+chip->oscsenabled);
				if (chip->SmpRateFunc != NULL)
					chip->SmpRateFunc(chip->SmpRateData, chip->output_rate);
				break;

			case 0xe2:  // A/D converter
				break;
		}
	}
}